

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  uint size;
  Node *block;
  undefined4 uVar1;
  int iVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  AuxsetnodeT asn;
  Table *local_40;
  uint local_38;
  
  size = t->sizearray;
  if (t->lastfree == (Node *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (size < nasize) {
    setarrayvector(L,t,nasize);
  }
  local_40 = t;
  local_38 = nhsize;
  iVar2 = luaD_rawrunprotected(L,auxsetnode,&local_40);
  if (iVar2 == 0) {
    if (nasize < size) {
      t->sizearray = nasize;
      uVar6 = (ulong)nasize;
      lVar7 = uVar6 << 4;
      uVar5 = uVar6;
      do {
        uVar5 = uVar5 + 1;
        if (*(int *)((long)&t->array->tt_ + lVar7) != 0) {
          luaH_setint(L,t,uVar5,(TValue *)((long)&t->array->value_ + lVar7));
        }
        lVar7 = lVar7 + 0x10;
      } while (uVar5 != size);
      pTVar3 = (TValue *)luaM_realloc_(L,t->array,(ulong)size << 4,uVar6 << 4);
      t->array = pTVar3;
    }
    if (0 < (int)uVar8) {
      uVar6 = (ulong)uVar8;
      uVar5 = uVar6 + 1;
      pTVar3 = (TValue *)&block[uVar6 - 1].i_key;
      do {
        if (pTVar3[-1].tt_ != 0) {
          pTVar4 = luaH_set(L,t,pTVar3);
          iVar2 = pTVar3[-1].tt_;
          uVar1 = *(undefined4 *)&pTVar3[-1].field_0xc;
          pTVar4->value_ = pTVar3[-1].value_;
          pTVar4->tt_ = iVar2;
          *(undefined4 *)&pTVar4->field_0xc = uVar1;
        }
        uVar5 = uVar5 - 1;
        pTVar3 = pTVar3 + -2;
      } while (1 < uVar5);
      if (0 < (int)uVar8) {
        luaM_realloc_(L,block,uVar6 << 5,0);
      }
    }
    return;
  }
  setarrayvector(L,t,size);
  luaD_throw(L,4);
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int nasize,
                                          unsigned int nhsize) {
  unsigned int i;
  int j;
  AuxsetnodeT asn;
  unsigned int oldasize = t->sizearray;
  int oldhsize = allocsizenode(t);
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  asn.t = t; asn.nhsize = nhsize;
  if (luaD_rawrunprotected(L, auxsetnode, &asn) != LUA_OK) {  /* mem. error? */
    setarrayvector(L, t, oldasize);  /* array back to its original size */
    luaD_throw(L, LUA_ERRMEM);  /* rethrow memory error */
  }
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (j = oldhsize - 1; j >= 0; j--) {
    Node *old = nold + j;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (oldhsize > 0)  /* not the dummy node? */
    luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}